

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_ChaseLastKnownPosition(void)

{
  iterator __position;
  pointer pTVar1;
  _Manager_type p_Var2;
  Task *in_RDI;
  int in_R8D;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  Vector3 debugSphereColour;
  Task moveToLastKnownLocation;
  Task bark;
  _Any_data local_748;
  _Manager_type local_738;
  _Invoker_type local_730;
  string local_728;
  Task local_708;
  undefined1 local_390 [888];
  
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"chaseLastKnownPosition","");
  Task::Task(in_RDI,&local_728,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  in_RDI->identifier = ChaseLastKnownPosition;
  local_390._0_4_ = Alertness;
  __position._M_current =
       (in_RDI->preconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (in_RDI->preconditions).consumableVectors.
      super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::_M_realloc_insert<ConsumableFact>
              (&(in_RDI->preconditions).consumableVectors,__position,(ConsumableFact *)local_390);
  }
  else {
    *__position._M_current = Player_LastKnownLocation;
    (in_RDI->preconditions).consumableVectors.
    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_390._0_4_ = PlayerIdentified;
  local_390[4] = false;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)local_390);
  create_Bark((Task *)local_390,LostSightOfPlayer);
  debugSphereColour.z = in_XMM2_Da;
  debugSphereColour.x = (float)(int)in_XMM1_Qa;
  debugSphereColour.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  create_MoveToDestination(&local_708,(AI *)0x1,320.0,debugSphereColour,1.0,true,true,in_R8D);
  local_748._M_unused._M_member_pointer = (ulong)(uint)local_748._4_4_ << 0x20;
  if (local_708.preconditions.consumableVectors.
      super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_708.preconditions.consumableVectors.
      super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::_M_realloc_insert<ConsumableFact>
              (&local_708.preconditions.consumableVectors,
               (iterator)
               local_708.preconditions.consumableVectors.
               super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
               super__Vector_impl_data._M_finish,(ConsumableFact *)local_748._M_pod_data);
  }
  else {
    *local_708.preconditions.consumableVectors.
     super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
     super__Vector_impl_data._M_finish = Player_LastKnownLocation;
    local_708.preconditions.consumableVectors.
    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_708.preconditions.consumableVectors.
         super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  p_Var2 = local_708.setup.super__Function_base._M_manager;
  local_748._M_unused._M_object =
       local_708.setup.super__Function_base._M_functor._M_unused._M_object;
  local_748._8_8_ = local_708.setup.super__Function_base._M_functor._8_8_;
  local_708.setup.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_708.setup.super__Function_base._M_functor._8_8_ = 0;
  local_738 = local_708.setup.super__Function_base._M_manager;
  local_708.setup.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:315:35)>
       ::_M_manager;
  local_730 = local_708.setup._M_invoker;
  local_708.setup._M_invoker =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:315:35)>
       ::_M_invoke;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_748,&local_748,__destroy_functor);
  }
  p_Var2 = local_708.loop.super__Function_base._M_manager;
  local_748._M_unused._M_object = local_708.loop.super__Function_base._M_functor._M_unused._M_object
  ;
  local_748._8_8_ = local_708.loop.super__Function_base._M_functor._8_8_;
  local_708.loop.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_708.loop.super__Function_base._M_functor._8_8_ = 0;
  local_738 = local_708.loop.super__Function_base._M_manager;
  local_708.loop.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:319:34)>
       ::_M_manager;
  local_730 = (_Invoker_type)local_708.loop._M_invoker;
  local_708.loop._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:319:34)>
       ::_M_invoke;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_748,&local_748,__destroy_functor);
  }
  p_Var2 = local_708.finish.super__Function_base._M_manager;
  local_748._M_unused._M_object =
       local_708.finish.super__Function_base._M_functor._M_unused._M_object;
  local_748._8_8_ = local_708.finish.super__Function_base._M_functor._8_8_;
  local_708.finish.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_708.finish.super__Function_base._M_functor._8_8_ = 0;
  local_738 = local_708.finish.super__Function_base._M_manager;
  local_708.finish.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:332:36)>
       ::_M_manager;
  local_730 = (_Invoker_type)local_708.finish._M_invoker;
  local_708.finish._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:332:36)>
       ::_M_invoke;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_748,&local_748,__destroy_functor);
  }
  p_Var2 = local_708.finally.super__Function_base._M_manager;
  local_748._M_unused._M_object =
       local_708.finally.super__Function_base._M_functor._M_unused._M_object;
  local_748._8_8_ = local_708.finally.super__Function_base._M_functor._8_8_;
  local_708.finally.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_708.finally.super__Function_base._M_functor._8_8_ = 0;
  local_738 = local_708.finally.super__Function_base._M_manager;
  local_708.finally.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:337:37)>
       ::_M_manager;
  local_730 = (_Invoker_type)local_708.finally._M_invoker;
  local_708.finally._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:337:37)>
       ::_M_invoke;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_748,&local_748,__destroy_functor);
  }
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back
            (&in_RDI->subtasks,(value_type *)local_390);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(&in_RDI->subtasks,&local_708);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  Task::~Task(&local_708);
  Task::~Task((Task *)local_390);
  return in_RDI;
}

Assistant:

Task create_ChaseLastKnownPosition()
	{
		Task chaseLastKnownPosition {"chaseLastKnownPosition", TaskType::Compound};
		chaseLastKnownPosition.identifier = TaskIdentifier::ChaseLastKnownPosition;
		chaseLastKnownPosition.preconditions.consumableVectors.push_back(ConsumableFact::Player_LastKnownLocation);
		chaseLastKnownPosition.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, false});

		auto bark = create_Bark(Bark::LostSightOfPlayer);	

		auto moveToLastKnownLocation = create_MoveToDestination(320.f, {0.f, 1.f, 0.f});
		moveToLastKnownLocation.preconditions.consumableVectors.push_back(ConsumableFact::Player_LastKnownLocation);
		moveToLastKnownLocation.setup = [=](Task& task, WorldState& state, const WorldQuerier&)
		{
			state.current.vectors[WorldStateIdentifier::Destination] = state.facts.vectors[ConsumableFact::Player_LastKnownLocation].value;
		};
		moveToLastKnownLocation.loop = [](WorldState& state, WorldQuerier const&, Task& task)
		{
			/*auto& target = state.current.vectors[WorldStateIdentifier::PlayerPosition];
			auto& start = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto xAxis = target - start;
			xAxis.normalize();
			
			state.animationDriver->isHeadTracking = true;
			state.animationDriver->headRotation = 				
				(FRotationMatrix::MakeFromXZ(xAxis, {0.f, 0.f, 1.f}).ToQuat() * FQuat(FRotator(90, 0, 0)) * FQuat(FRotator(0.f, 0.f, 90.f))).Rotator();
			*/
		};

		moveToLastKnownLocation.finish = [](WorldState& state, Task& task)
		{
			state.consumeFactVector(ConsumableFact::Player_LastKnownLocation);
		};

		moveToLastKnownLocation.finally = [](WorldState& state)
		{
			//state.animationDriver->isHeadTracking = false;
		};
		
		chaseLastKnownPosition.addSubtask(bark);
		chaseLastKnownPosition.addSubtask(moveToLastKnownLocation);

		return chaseLastKnownPosition;
	}